

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O2

void __thiscall
IR::PropertySymOpnd::TryDepolymorphication
          (PropertySymOpnd *this,JITTypeHolder type,uint16 slotIndex,bool usesAuxSlot,
          uint16 *pNewSlotIndex,bool *pNewUsesAuxSlot,uint16 *checkedTypeSetIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ObjTypeSpecFldInfo *this_00;
  
  this_00 = this->objTypeSpecFldInfo;
  if (this_00 == (ObjTypeSpecFldInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x530,"(HasObjTypeSpecFldInfo())","HasObjTypeSpecFldInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = this->objTypeSpecFldInfo;
  }
  ObjTypeSpecFldInfo::TryDepolymorphication
            (this_00,type,slotIndex,usesAuxSlot,pNewSlotIndex,pNewUsesAuxSlot,checkedTypeSetIndex);
  return;
}

Assistant:

void TryDepolymorphication(JITTypeHolder type, uint16 slotIndex, bool usesAuxSlot, uint16 * pNewSlotIndex, bool * pNewUsesAuxSlot, uint16 * checkedTypeSetIndex = nullptr) const
    {
        Assert(HasObjTypeSpecFldInfo());
        return this->objTypeSpecFldInfo->TryDepolymorphication(type, slotIndex, usesAuxSlot, pNewSlotIndex, pNewUsesAuxSlot, checkedTypeSetIndex);
    }